

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O3

IntBounds * __thiscall
GlobOpt::GetIntBoundsToUpdate
          (GlobOpt *this,ValueInfo *valueInfo,IntConstantBounds *constantBounds,
          bool isSettingNewBound,bool isBoundConstant,bool isSettingUpperBound,bool isExplicit)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  IntBoundedValueInfo *pIVar4;
  IntBounds *pIVar5;
  
  if (valueInfo == (ValueInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x16c,"(valueInfo)","valueInfo");
    if (!bVar2) goto LAB_004a1cd2;
    *puVar3 = 0;
  }
  bVar2 = ValueType::IsLikelyInt(&valueInfo->super_ValueType);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x16d,"(valueInfo->IsLikelyInt())","valueInfo->IsLikelyInt()");
    if (!bVar2) {
LAB_004a1cd2:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = DoTrackRelativeIntBounds(this);
  if (bVar2) {
    bVar2 = ValueInfo::IsIntBounded(valueInfo);
    if (bVar2) {
      pIVar4 = ValueInfo::AsIntBounded(valueInfo);
      pIVar5 = pIVar4->bounds;
      bVar2 = IntBounds::RequiresIntBoundedValueInfo
                        (pIVar5,(ValueType)
                                *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                                 &(valueInfo->super_ValueType).field_0.field_0);
      if (bVar2) {
        pIVar5 = IntBounds::Clone(pIVar5);
        return pIVar5;
      }
    }
    bVar2 = ValueType::IsInt(&valueInfo->super_ValueType);
    if ((bVar2) && (constantBounds->lowerBound != constantBounds->upperBound)) {
      if (isBoundConstant) {
        if (isSettingUpperBound && isExplicit) {
LAB_004a1cb3:
          pIVar5 = IntBounds::New(constantBounds,false,this->alloc);
          return pIVar5;
        }
      }
      else if (isSettingNewBound) goto LAB_004a1cb3;
    }
  }
  return (IntBounds *)0x0;
}

Assistant:

IntBounds *GlobOpt::GetIntBoundsToUpdate(
    const ValueInfo *const valueInfo,
    const IntConstantBounds &constantBounds,
    const bool isSettingNewBound,
    const bool isBoundConstant,
    const bool isSettingUpperBound,
    const bool isExplicit)
{
    Assert(valueInfo);
    Assert(valueInfo->IsLikelyInt());

    if(!DoTrackRelativeIntBounds())
    {
        return nullptr;
    }

    if(valueInfo->IsIntBounded())
    {
        const IntBounds *const bounds = valueInfo->AsIntBounded()->Bounds();
        if(bounds->RequiresIntBoundedValueInfo(valueInfo->Type()))
        {
            return bounds->Clone();
        }
    }

    if(valueInfo->IsInt())
    {
        if(constantBounds.IsConstant())
        {
            // Don't start tracking relative bounds for int constant values, just retain existing relative bounds. Will use
            // IntConstantValueInfo instead.
            return nullptr;
        }

        if(isBoundConstant)
        {
            // There are no relative bounds to track
            if(!(isSettingUpperBound && isExplicit))
            {
                // We are not setting a constant upper bound that is established explicitly, will use IntRangeValueInfo instead
                return nullptr;
            }
        }
        else if(!isSettingNewBound)
        {
            // New relative bounds are not being set, will use IntRangeValueInfo instead
            return nullptr;
        }
        return IntBounds::New(constantBounds, false, alloc);
    }

    return nullptr;
}